

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

bool __thiscall wabt::WastParser::ParseBindVarOpt(WastParser *this,string *name)

{
  bool bVar1;
  string_view local_90;
  string local_80;
  undefined1 local_60 [8];
  Token token;
  string *name_local;
  WastParser *this_local;
  
  token.field_2.literal_.text.size_ = (size_type)name;
  bVar1 = PeekMatch(this,Last_String);
  if (bVar1) {
    Consume((Token *)local_60,this);
    local_90 = Token::text((Token *)local_60);
    string_view::to_string_abi_cxx11_(&local_80,&local_90);
    std::__cxx11::string::operator=((string *)token.field_2.literal_.text.size_,(string *)&local_80)
    ;
    std::__cxx11::string::~string((string *)&local_80);
  }
  return bVar1;
}

Assistant:

bool WastParser::ParseBindVarOpt(std::string* name) {
  WABT_TRACE(ParseBindVarOpt);
  if (!PeekMatch(TokenType::Var)) {
    return false;
  }
  Token token = Consume();
  *name = token.text().to_string();
  return true;
}